

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

HostVector<Real> *
amrex::sumToLine(MultiFab *mf,int icomp,int ncomp,Box *domain,int direction,bool local)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double **ppdVar5;
  PODVector<double,_std::allocator<double>_> *this;
  double *pdVar6;
  reference this_00;
  int in_ECX;
  PODVector<double,_std::allocator<double>_> *in_RDI;
  Box *in_R8;
  int in_R9D;
  byte in_stack_00000008;
  PODVector<double,_std::allocator<double>_> *v;
  iterator __end4;
  iterator __begin4;
  Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  *__range4;
  int i_1;
  Real *p;
  Array4<const_double> *fab;
  Box *b;
  MFIter mfi;
  int i;
  Vector<double_*,_std::allocator<double_*>_> pp;
  Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  other_hv;
  double *x;
  iterator __end2;
  iterator __begin2;
  HostVector<Real> *__range2;
  int n1d;
  HostVector<Real> *hv;
  MPI_Comm in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  MFIter *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffd80;
  double dVar7;
  size_type in_stack_fffffffffffffd88;
  undefined1 *puVar8;
  PODVector<double,_std::allocator<double>_> *in_stack_fffffffffffffd90;
  FabArrayBase *in_stack_fffffffffffffd98;
  undefined1 *puVar9;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  anon_class_32_4_8edbfccf *in_stack_fffffffffffffdb8;
  int iVar10;
  Box *bx;
  undefined4 in_stack_fffffffffffffdd0;
  __normal_iterator<amrex::PODVector<double,_std::allocator<double>_>_*,_std::vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>_>
  local_1f0;
  undefined1 *local_1e8;
  int local_1dc;
  double **local_1d8;
  int *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  double **local_1b8;
  int *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  double **local_198;
  int *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  double *local_178;
  undefined1 local_170 [64];
  undefined1 *local_130;
  undefined1 local_124 [28];
  undefined1 *local_108;
  MFIter local_100;
  undefined8 local_a0;
  int local_98;
  Box local_91;
  undefined1 local_68 [24];
  iterator local_50;
  iterator local_48;
  iterator local_40;
  PODVector<double,_std::allocator<double>_> *local_38;
  undefined1 local_2d;
  int local_2c;
  byte local_25;
  int local_24;
  int local_18;
  undefined1 local_14 [20];
  
  local_25 = in_stack_00000008 & 1;
  local_24 = in_R9D;
  local_18 = in_ECX;
  local_2c = Box::length(in_R8,in_R9D);
  local_2c = local_2c * local_18;
  local_2d = 0;
  PODVector<double,_std::allocator<double>_>::PODVector
            ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  local_38 = in_RDI;
  local_40 = PODVector<double,_std::allocator<double>_>::begin(in_RDI);
  local_48 = PODVector<double,_std::allocator<double>_>::end(local_38);
  for (; local_40 != local_48; local_40 = local_40 + 1) {
    local_50 = local_40;
    *local_40 = 0.0;
  }
  OpenMP::get_max_threads();
  std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>::allocator
            ((allocator<amrex::PODVector<double,_std::allocator<double>_>_> *)0x12de1e9);
  Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  ::vector((Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd70,
           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(allocator_type *)0x12de200
          );
  std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<amrex::PODVector<double,_std::allocator<double>_>_> *)0x12de20f);
  iVar2 = OpenMP::get_max_threads();
  lVar4 = (long)iVar2;
  bx = &local_91;
  std::allocator<double_*>::allocator((allocator<double_*> *)0x12de237);
  Vector<double_*,_std::allocator<double_*>_>::vector
            ((Vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffd70,
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (allocator_type *)0x12de24e);
  std::allocator<double_*>::~allocator((allocator<double_*> *)0x12de25d);
  bVar1 = std::vector<double_*,_std::allocator<double_*>_>::empty
                    ((vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffd80);
  if (!bVar1) {
    in_stack_fffffffffffffdb8 =
         (anon_class_32_4_8edbfccf *)PODVector<double,_std::allocator<double>_>::data(in_RDI);
    ppdVar5 = Vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((Vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffd70,
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    *ppdVar5 = (double *)in_stack_fffffffffffffdb8;
  }
  for (local_98 = 1; iVar10 = local_98, iVar3 = OpenMP::get_max_threads(), iVar10 < iVar3;
      local_98 = local_98 + 1) {
    Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
    ::operator[]((Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffffd70,
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_a0 = 0;
    PODVector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (double *)in_stack_fffffffffffffd80);
    this = Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
           ::operator[]((Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
                         *)in_stack_fffffffffffffd70,
                        CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    pdVar6 = PODVector<double,_std::allocator<double>_>::data(this);
    ppdVar5 = Vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((Vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffd70,
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    *ppdVar5 = pdVar6;
  }
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd98,SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
  while (bVar1 = MFIter::isValid(&local_100), bVar1) {
    puVar8 = local_124;
    MFIter::tilebox((MFIter *)CONCAT44(iVar2,in_stack_fffffffffffffdd0));
    puVar9 = local_170;
    local_108 = puVar8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    local_130 = puVar9;
    OpenMP::get_thread_num();
    ppdVar5 = Vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((Vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffd70,
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_178 = *ppdVar5;
    iVar10 = (int)((ulong)lVar4 >> 0x20);
    if (local_24 == 0) {
      local_198 = &local_178;
      local_190 = &local_18;
      local_188 = local_130;
      local_180 = local_14;
      LoopOnCpu<amrex::sumToLine(amrex::MultiFab_const&,int,int,amrex::Box_const&,int,bool)::__0>
                (bx,iVar10,in_stack_fffffffffffffdb8);
    }
    else if (local_24 == 1) {
      local_1b8 = &local_178;
      local_1b0 = &local_18;
      local_1a8 = local_130;
      local_1a0 = local_14;
      LoopOnCpu<amrex::sumToLine(amrex::MultiFab_const&,int,int,amrex::Box_const&,int,bool)::__1>
                (bx,iVar10,in_stack_fffffffffffffdb8);
    }
    else {
      local_1d8 = &local_178;
      local_1d0 = &local_18;
      local_1c8 = local_130;
      local_1c0 = local_14;
      LoopOnCpu<amrex::sumToLine(amrex::MultiFab_const&,int,int,amrex::Box_const&,int,bool)::__2>
                (bx,iVar10,in_stack_fffffffffffffdb8);
    }
    MFIter::operator++(&local_100);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd70);
  bVar1 = std::
          vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
          ::empty(in_stack_fffffffffffffd80);
  if (!bVar1) {
    for (local_1dc = 0; local_1dc < local_2c; local_1dc = local_1dc + 1) {
      local_1e8 = local_68;
      local_1f0._M_current =
           (PODVector<double,_std::allocator<double>_> *)
           std::
           vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
           ::begin((vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::
      vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
      ::end((vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<amrex::PODVector<double,_std::allocator<double>_>_*,_std::vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>_>
                                 *)in_stack_fffffffffffffd70,
                                (__normal_iterator<amrex::PODVector<double,_std::allocator<double>_>_*,_std::vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)),
            bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<amrex::PODVector<double,_std::allocator<double>_>_*,_std::vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>_>
                  ::operator*(&local_1f0);
        pdVar6 = PODVector<double,_std::allocator<double>_>::operator[](this_00,(long)local_1dc);
        dVar7 = *pdVar6;
        pdVar6 = PODVector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_1dc);
        *pdVar6 = dVar7 + *pdVar6;
        __gnu_cxx::
        __normal_iterator<amrex::PODVector<double,_std::allocator<double>_>_*,_std::vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>_>
        ::operator++(&local_1f0);
      }
    }
  }
  Vector<double_*,_std::allocator<double_*>_>::~Vector
            ((Vector<double_*,_std::allocator<double_*>_> *)0x12de74a);
  Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  ::~Vector((Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
             *)0x12de757);
  if ((local_25 & 1) == 0) {
    pdVar6 = PODVector<double,_std::allocator<double>_>::data(in_RDI);
    PODVector<double,_std::allocator<double>_>::size(in_RDI);
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>(pdVar6,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
  }
  return in_RDI;
}

Assistant:

Gpu::HostVector<Real> sumToLine (MultiFab const& mf, int icomp, int ncomp,
                                     Box const& domain, int direction, bool local)
    {
        int n1d = domain.length(direction) * ncomp;
        Gpu::HostVector<Real> hv(n1d);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            Gpu::DeviceVector<Real> dv(domain.length(direction), Real(0.0));
            Real* p = dv.data();

            for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
                Box const& b = mfi.validbox();
                const auto lo = amrex::lbound(b);
                const auto len = amrex::length(b);
                auto const& fab = mf.const_array(mfi);

                int n2d, n2dx;
                if (direction == 0) {
                    n2d = len.y * len.z;
                    n2dx = len.y;
                } else if (direction == 1) {
                    n2d = len.x * len.z;
                    n2dx = len.x;
                } else {
                    n2d = len.x * len.y;
                    n2dx = len.x;
                }
                int n2dblocks = (n2d+AMREX_GPU_MAX_THREADS-1)/AMREX_GPU_MAX_THREADS;
                int nblocks = n2dblocks * b.length(direction);
#ifdef AMREX_USE_DPCPP
                std::size_t shared_mem_byte = sizeof(Real)*Gpu::Device::warp_size;
                amrex::launch(nblocks, AMREX_GPU_MAX_THREADS, shared_mem_byte, Gpu::gpuStream(),
                              [=] AMREX_GPU_DEVICE (Gpu::Handler const& h) noexcept
#else
                amrex::launch(nblocks, AMREX_GPU_MAX_THREADS, Gpu::gpuStream(),
                              [=] AMREX_GPU_DEVICE () noexcept
#endif
                {
#ifdef AMREX_USE_DPCPP
                    int i1d = h.blockIdx() / n2dblocks;
                    int i2d = h.threadIdx() + h.blockDim()*(h.blockIdx()-i1d*n2dblocks);
#else
                    int i1d = blockIdx.x / n2dblocks;
                    int i2d = threadIdx.x + blockDim.x*(blockIdx.x-i1d*n2dblocks);
#endif
                    int i2dy = i2d / n2dx;
                    int i2dx = i2d - i2dy*n2dx;
                    int i, j, k, idir;
                    if (direction == 0) {
                        i = i1d  + lo.x;
                        j = i2dx + lo.y;
                        k = i2dy + lo.z;
                        idir = i;
                    } else if (direction == 1) {
                        i = i2dx + lo.x;
                        j = i1d  + lo.y;
                        k = i2dy + lo.z;
                        idir = j;
                    } else {
                        i = i2dx + lo.x;
                        j = i2dy + lo.y;
                        k = i1d  + lo.z;
                        idir = k;
                    }
                    for (int n = 0; n < ncomp; ++n) {
                        Real r = (i2d < n2d) ? fab(i,j,k,n+icomp) : Real(0.0);
#ifdef AMREX_USE_DPCPP
                        Gpu::deviceReduceSum_full(p+n+ncomp*idir, r, h);
#else
                        Gpu::deviceReduceSum_full(p+n+ncomp*idir, r);
#endif
                    }
                });
            }

            Gpu::copyAsync(Gpu::deviceToHost, dv.begin(), dv.end(), hv.begin());
            Gpu::streamSynchronize();
        }
        else
#endif
        {
            for (auto& x : hv) {
                x = Real(0.0);
            }

            Vector<Gpu::HostVector<Real> > other_hv(OpenMP::get_max_threads()-1);

            Vector<Real*> pp(OpenMP::get_max_threads());
            if (!pp.empty()) {
                pp[0] = hv.data();
            }
            for (int i = 1; i < OpenMP::get_max_threads(); ++i) {
                other_hv[i-1].resize(n1d, Real(0.0));
                pp[i] = other_hv[i-1].data();
            }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
            for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                Box const& b = mfi.tilebox();
                auto const& fab = mf.const_array(mfi);
                Real * AMREX_RESTRICT p = pp[OpenMP::get_thread_num()];
                if (direction == 0) {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*i] += fab(i,j,k,n+icomp);
                    });
                } else if (direction == 1) {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*j] += fab(i,j,k,n+icomp);
                    });
                } else {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*k] += fab(i,j,k,n+icomp);
                    });
                }
            }

            if (! other_hv.empty()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
                for (int i = 0; i < n1d; ++i) {
                    for (auto const& v : other_hv) {
                        hv[i] += v[i];
                    }
                }
            }
        }

        if (!local) {
            ParallelAllReduce::Sum(hv.data(), hv.size(), ParallelContext::CommunicatorSub());
        }
        return hv;
    }